

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_get_string_length(coda_type *type,long *length)

{
  char *pcVar1;
  long local_28;
  long *length_local;
  coda_type *type_local;
  
  if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xb6f);
    type_local._4_4_ = -1;
  }
  else if (type->type_class == coda_text_class) {
    if (length == (long *)0x0) {
      coda_set_error(-100,"length argument is NULL (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                     ,0xb7a);
      type_local._4_4_ = -1;
    }
    else {
      if (type->bit_size < 0) {
        local_28 = -1;
      }
      else {
        local_28 = type->bit_size >> 3;
      }
      *length = local_28;
      type_local._4_4_ = 0;
    }
  }
  else {
    pcVar1 = coda_type_get_class_name(type->type_class);
    coda_set_error(-0x69,"type does not refer to text (current type is %s)",pcVar1);
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

LIBCODA_API int coda_type_get_string_length(const coda_type *type, long *length)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->type_class != coda_text_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "type does not refer to text (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }
    if (length == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "length argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *length = (type->bit_size < 0 ? -1 : (long)(type->bit_size >> 3));
    return 0;
}